

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.hpp
# Opt level: O2

size_t Lodtalk::variableSlotSizeFor(ObjectFormat format)

{
  if ((format < 0x20) && ((0xfffffe3fU >> (format & OF_COMPILED_METHOD_7) & 1) != 0)) {
    return *(size_t *)(&DAT_0015c570 + (ulong)format * 8);
  }
  abort();
}

Assistant:

inline size_t variableSlotSizeFor(ObjectFormat format)
{
	switch(format)
	{
	case OF_EMPTY:
	case OF_FIXED_SIZE:
		return 0;
	case OF_VARIABLE_SIZE_NO_IVARS:
	case OF_VARIABLE_SIZE_IVARS:
	case OF_WEAK_VARIABLE_SIZE:
		return sizeof(void*);
	case OF_WEAK_FIXED_SIZE:
		return 0;
	case OF_INDEXABLE_64:
		return 8;
	case OF_INDEXABLE_32:
	case OF_INDEXABLE_32_1:
		return 4;
	case OF_INDEXABLE_16:
	case OF_INDEXABLE_16_1:
	case OF_INDEXABLE_16_2:
	case OF_INDEXABLE_16_3:
		return 2;
	case OF_INDEXABLE_8:
	case OF_INDEXABLE_8_1:
	case OF_INDEXABLE_8_2:
	case OF_INDEXABLE_8_3:
	case OF_INDEXABLE_8_4:
	case OF_INDEXABLE_8_5:
	case OF_INDEXABLE_8_6:
	case OF_INDEXABLE_8_7:
	case OF_COMPILED_METHOD:
	case OF_COMPILED_METHOD_1:
	case OF_COMPILED_METHOD_2:
	case OF_COMPILED_METHOD_3:
	case OF_COMPILED_METHOD_4:
	case OF_COMPILED_METHOD_5:
	case OF_COMPILED_METHOD_6:
	case OF_COMPILED_METHOD_7:
		return 1;
	default: abort();
	}
}